

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LoopStatements.cpp
# Opt level: O1

Statement *
slang::ast::ReturnStatement::fromSyntax
          (Compilation *compilation,ReturnStatementSyntax *syntax,ASTContext *context,
          StatementContext *stmtCtx)

{
  SymbolKind SVar1;
  Scope *pSVar2;
  Symbol *pSVar3;
  bool bVar4;
  ASTContext *pAVar5;
  DeclaredType *this;
  Type *this_00;
  ReturnStatement *stmt;
  Statement *pSVar6;
  SourceRange assignmentRange;
  SourceRange SVar7;
  Expression *retExpr;
  bitmask<slang::ast::ASTFlags> in_stack_ffffffffffffffa8;
  Expression *local_48;
  SourceRange local_40;
  
  pAVar5 = context;
  if (((stmtCtx->flags).m_bits & 2) != 0) {
    SVar7 = slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)syntax);
    ASTContext::addDiag(context,(DiagCode)0x410008,SVar7);
LAB_00441b46:
    pSVar6 = Statement::badStmt(compilation,(Statement *)0x0);
    return pSVar6;
  }
  do {
    pSVar2 = (pAVar5->scope).ptr;
    pSVar3 = pSVar2->thisSym;
    pAVar5 = (ASTContext *)&pSVar3->parentScope;
  } while (pSVar3->kind == StatementBlock);
  SVar7 = parsing::Token::range(&syntax->returnKeyword);
  pSVar3 = pSVar2->thisSym;
  if ((pSVar3->kind != Subroutine) && (pSVar3->kind != RandSeqProduction)) {
    ASTContext::addDiag(context,(DiagCode)0x420008,SVar7);
    goto LAB_00441b46;
  }
  this = Symbol::getDeclaredType(pSVar3);
  this_00 = DeclaredType::getType(this);
  local_48 = (Expression *)0x0;
  if ((Type *)syntax->returnValue == (Type *)0x0) {
    if (this_00->canonical == (Type *)0x0) {
      Type::resolveCanonical(this_00);
    }
    if ((this_00->canonical->super_Symbol).kind != VoidType) {
      SVar1 = pSVar3->kind;
      SVar7 = slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)syntax);
      ASTContext::addDiag(context,(DiagCode)((uint)(SVar1 != Subroutine) * 0x10000 + 0x6f0007),SVar7
                         );
      stmt = (ReturnStatement *)0x0;
      goto LAB_00441be8;
    }
  }
  else {
    assignmentRange.endLoc = (SourceLocation)context;
    assignmentRange.startLoc = SVar7.endLoc;
    local_48 = Expression::bindRValue
                         ((Expression *)this_00,(Type *)syntax->returnValue,
                          (ExpressionSyntax *)SVar7.startLoc,assignmentRange,(ASTContext *)0x0,
                          in_stack_ffffffffffffffa8);
  }
  local_40 = slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)syntax);
  stmt = BumpAllocator::
         emplace<slang::ast::ReturnStatement,slang::ast::Expression_const*&,slang::SourceRange>
                   (&compilation->super_BumpAllocator,&local_48,&local_40);
  if (local_48 == (Expression *)0x0) {
    return &stmt->super_Statement;
  }
  bVar4 = Expression::bad(local_48);
  if (!bVar4) {
    return &stmt->super_Statement;
  }
LAB_00441be8:
  pSVar6 = Statement::badStmt(compilation,&stmt->super_Statement);
  return pSVar6;
}

Assistant:

Statement& ReturnStatement::fromSyntax(Compilation& compilation,
                                       const ReturnStatementSyntax& syntax,
                                       const ASTContext& context, StatementContext& stmtCtx) {
    if (stmtCtx.flags.has(StatementFlags::InForkJoin)) {
        context.addDiag(diag::ReturnInParallel, syntax.sourceRange());
        return badStmt(compilation, nullptr);
    }

    // Find the parent subroutine or randsequence production.
    const Scope* scope = context.scope;
    while (scope->asSymbol().kind == SymbolKind::StatementBlock)
        scope = scope->asSymbol().getParentScope();

    auto stmtRange = syntax.returnKeyword.range();
    auto& symbol = scope->asSymbol();
    if (symbol.kind != SymbolKind::Subroutine && symbol.kind != SymbolKind::RandSeqProduction) {
        context.addDiag(diag::ReturnNotInSubroutine, stmtRange);
        return badStmt(compilation, nullptr);
    }

    auto& returnType = symbol.getDeclaredType()->getType();
    const Expression* retExpr = nullptr;
    if (syntax.returnValue) {
        retExpr = &Expression::bindRValue(returnType, *syntax.returnValue, stmtRange, context);
    }
    else if (!returnType.isVoid()) {
        DiagCode code = symbol.kind == SymbolKind::Subroutine ? diag::MissingReturnValue
                                                              : diag::MissingReturnValueProd;
        context.addDiag(code, syntax.sourceRange());
        return badStmt(compilation, nullptr);
    }

    auto result = compilation.emplace<ReturnStatement>(retExpr, syntax.sourceRange());
    if (retExpr && retExpr->bad())
        return badStmt(compilation, result);

    return *result;
}